

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

void __thiscall xLearn::OndiskReader::Reset(OndiskReader *this)

{
  int iVar1;
  ostream *poVar2;
  allocator local_4e;
  allocator local_4d;
  Logger local_4c;
  string local_48;
  string local_28;
  
  iVar1 = fseek((FILE *)this->file_ptr_,0,0);
  if (iVar1 != 0) {
    local_4c.severity_ = FATAL;
    std::__cxx11::string::string
              ((string *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
               ,&local_4d);
    std::__cxx11::string::string((string *)&local_48,"Reset",&local_4e);
    poVar2 = Logger::Start(FATAL,&local_28,0x13d,&local_48);
    std::operator<<(poVar2,"Fail to return to the head of file.");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    Logger::~Logger(&local_4c);
  }
  return;
}

Assistant:

void OndiskReader::Reset() {
  int ret = fseek(file_ptr_, 0, SEEK_SET);
  if (ret != 0) {
    LOG(FATAL) << "Fail to return to the head of file.";
  }
}